

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreeCellSizeCheck(MemPage *pPage)

{
  u8 uVar1;
  ushort uVar2;
  ushort uVar3;
  u32 uVar4;
  u8 *puVar5;
  ushort uVar6;
  u16 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  
  uVar2 = pPage->nCell;
  uVar4 = pPage->pBt->usableSize;
  uVar1 = pPage->leaf;
  if (uVar2 != 0) {
    uVar3 = pPage->cellOffset;
    puVar5 = pPage->aData;
    uVar9 = 0;
    do {
      uVar6 = *(ushort *)(puVar5 + uVar9 * 2 + (ulong)uVar3);
      uVar6 = uVar6 << 8 | uVar6 >> 8;
      uVar8 = 0xfe7c;
      if (((uint)uVar6 < (uint)uVar3 + (uint)uVar2 * 2) ||
         ((int)((uVar4 - (uVar1 == '\0')) + -4) < (int)(uint)uVar6)) {
LAB_00139ec6:
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar8,
                    "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
        return 0xb;
      }
      uVar7 = (*pPage->xCellSize)(pPage,puVar5 + uVar6);
      if ((int)uVar4 < (int)((uint)uVar7 + (uint)uVar6)) {
        uVar8 = 0xfe81;
        goto LAB_00139ec6;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < pPage->nCell);
  }
  return 0;
}

Assistant:

static SQLITE_NOINLINE int btreeCellSizeCheck(MemPage *pPage){
  int iCellFirst;    /* First allowable cell or freeblock offset */
  int iCellLast;     /* Last possible cell or freeblock offset */
  int i;             /* Index into the cell pointer array */
  int sz;            /* Size of a cell */
  int pc;            /* Address of a freeblock within pPage->aData[] */
  u8 *data;          /* Equal to pPage->aData */
  int usableSize;    /* Maximum usable space on the page */
  int cellOffset;    /* Start of cell content area */

  iCellFirst = pPage->cellOffset + 2*pPage->nCell;
  usableSize = pPage->pBt->usableSize;
  iCellLast = usableSize - 4;
  data = pPage->aData;
  cellOffset = pPage->cellOffset;
  if( !pPage->leaf ) iCellLast--;
  for(i=0; i<pPage->nCell; i++){
    pc = get2byteAligned(&data[cellOffset+i*2]);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    sz = pPage->xCellSize(pPage, &data[pc]);
    testcase( pc+sz==usableSize );
    if( pc+sz>usableSize ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
  }
  return SQLITE_OK;
}